

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utext.cpp
# Opt level: O0

int32_t ucstrTextExtract(UText *ut,int64_t start,int64_t limit,UChar *dest,int32_t destCapacity,
                        UErrorCode *pErrorCode)

{
  int iVar1;
  long lVar2;
  UBool UVar3;
  int local_5c;
  int32_t strLength;
  UChar *s;
  int32_t limit32;
  int32_t start32;
  int32_t di;
  int32_t si;
  UErrorCode *pErrorCode_local;
  int32_t destCapacity_local;
  UChar *dest_local;
  int64_t limit_local;
  int64_t start_local;
  UText *ut_local;
  
  dest_local = (UChar *)limit;
  limit_local = start;
  start_local = (int64_t)ut;
  UVar3 = U_FAILURE(*pErrorCode);
  if (UVar3 == '\0') {
    if ((destCapacity < 0) ||
       (((dest == (UChar *)0x0 && (0 < destCapacity)) || ((long)dest_local < limit_local)))) {
      *pErrorCode = U_ILLEGAL_ARGUMENT_ERROR;
      ut_local._4_4_ = 0;
    }
    else {
      ucstrTextAccess((UText *)start_local,limit_local,'\x01');
      lVar2 = *(long *)(start_local + 0x30);
      iVar1 = *(int *)(start_local + 0x28);
      local_5c = (int)*(undefined8 *)(start_local + 0x70);
      if (local_5c < 0) {
        s._0_4_ = pinIndex((int64_t *)&dest_local,0x7fffffff);
      }
      else {
        s._0_4_ = pinIndex((int64_t *)&dest_local,(long)local_5c);
      }
      limit32 = 0;
      for (start32 = iVar1; start32 < (int32_t)s; start32 = start32 + 1) {
        if ((local_5c < 0) && (*(short *)(lVar2 + (long)start32 * 2) == 0)) {
          *(long *)(start_local + 0x70) = (long)start32;
          *(long *)(start_local + 0x10) = (long)start32;
          *(int32_t *)(start_local + 0x2c) = start32;
          *(int32_t *)(start_local + 0x1c) = start32;
          local_5c = start32;
          break;
        }
        if (limit32 < destCapacity) {
          dest[limit32] = *(UChar *)(lVar2 + (long)start32 * 2);
        }
        else if (-1 < local_5c) {
          limit32 = (int32_t)s - iVar1;
          start32 = (int32_t)s;
          break;
        }
        limit32 = limit32 + 1;
      }
      if ((((0 < start32) && ((*(ushort *)(lVar2 + (long)(start32 + -1) * 2) & 0xfc00) == 0xd800))
          && ((start32 < local_5c || (local_5c < 0)))) &&
         ((*(ushort *)(lVar2 + (long)start32 * 2) & 0xfc00) == 0xdc00)) {
        if (limit32 < destCapacity) {
          dest[limit32] = *(UChar *)(lVar2 + (long)start32 * 2);
          limit32 = limit32 + 1;
        }
        start32 = start32 + 1;
      }
      if (*(long *)(start_local + 0x10) < (long)start32) {
        ucstrTextAccess((UText *)start_local,(long)start32,'\x01');
      }
      else {
        *(int32_t *)(start_local + 0x28) = start32;
      }
      u_terminateUChars_63(dest,destCapacity,limit32,pErrorCode);
      ut_local._4_4_ = limit32;
    }
  }
  else {
    ut_local._4_4_ = 0;
  }
  return ut_local._4_4_;
}

Assistant:

static int32_t U_CALLCONV
ucstrTextExtract(UText *ut,
                  int64_t start, int64_t limit,
                  UChar *dest, int32_t destCapacity,
                  UErrorCode *pErrorCode)
{
    if(U_FAILURE(*pErrorCode)) {
        return 0;
    }
    if(destCapacity<0 || (dest==NULL && destCapacity>0) || start>limit) {
        *pErrorCode=U_ILLEGAL_ARGUMENT_ERROR;
        return 0;
    }

    //const UChar *s=(const UChar *)ut->context;
    int32_t si, di;

    int32_t start32;
    int32_t limit32;

    // Access the start.  Does two things we need:
    //   Pins 'start' to the length of the string, if it came in out-of-bounds.
    //   Snaps 'start' to the beginning of a code point.
    ucstrTextAccess(ut, start, TRUE);
    const UChar *s=ut->chunkContents;
    start32 = ut->chunkOffset;

    int32_t strLength=(int32_t)ut->a;
    if (strLength >= 0) {
        limit32 = pinIndex(limit, strLength);
    } else {
        limit32 = pinIndex(limit, INT32_MAX);
    }
    di = 0;
    for (si=start32; si<limit32; si++) {
        if (strLength<0 && s[si]==0) {
            // Just hit the end of a null-terminated string.
            ut->a = si;               // set string length for this UText
            ut->chunkNativeLimit    = si;
            ut->chunkLength         = si;
            ut->nativeIndexingLimit = si;
            strLength               = si;
            limit32                 = si;
            break;
        }
        U_ASSERT(di>=0); /* to ensure di never exceeds INT32_MAX, which must not happen logically */
        if (di<destCapacity) {
            // only store if there is space.
            dest[di] = s[si];
        } else {
            if (strLength>=0) {
                // We have filled the destination buffer, and the string length is known.
                //  Cut the loop short.  There is no need to scan string termination.
                di = limit32 - start32;
                si = limit32;
                break;
            }
        }
        di++;
    }

    // If the limit index points to a lead surrogate of a pair,
    //   add the corresponding trail surrogate to the destination.
    if (si>0 && U16_IS_LEAD(s[si-1]) &&
            ((si<strLength || strLength<0)  && U16_IS_TRAIL(s[si])))
    {
        if (di<destCapacity) {
            // store only if there is space in the output buffer.
            dest[di++] = s[si];
        }
        si++;
    }

    // Put iteration position at the point just following the extracted text
    if (si <= ut->chunkNativeLimit) {
        ut->chunkOffset = si;
    } else {
        ucstrTextAccess(ut, si, TRUE);
    }

    // Add a terminating NUL if space in the buffer permits,
    // and set the error status as required.
    u_terminateUChars(dest, destCapacity, di, pErrorCode);
    return di;
}